

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_solid_source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  if (const_alpha != 0xff) {
    if (0 < length) {
      uVar9 = (color >> 8 & 0xff00ff) * const_alpha;
      uVar7 = (color & 0xff00ff) * const_alpha;
      uVar8 = 0;
      do {
        uVar11 = (dest[uVar8] & 0xff00ff) * (0xff - const_alpha);
        uVar10 = (dest[uVar8] >> 8 & 0xff00ff) * (0xff - const_alpha);
        dest[uVar8] = (uVar10 + 0x800080 + (uVar10 >> 8 & 0xff00ff) & 0xff00ff00) +
                      (uVar11 + 0x800080 + (uVar11 >> 8 & 0xff00ff) >> 8 & 0xff00ff) +
                      (uVar7 + 0x800080 + (uVar7 >> 8 & 0xff00ff) >> 8 & 0xff00ff |
                      uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) & 0xff00ff00);
        uVar8 = uVar8 + 1;
      } while ((uint)length != uVar8);
    }
    return;
  }
  if (((ulong)dest & 0xf) != 0 && length != 0) {
    puVar5 = dest + 1;
    uVar7 = length;
    do {
      *dest = color;
      dest = dest + 1;
      length = uVar7 - 1;
      if (uVar7 == 1) break;
      uVar8 = (ulong)puVar5 & 0xf;
      puVar5 = puVar5 + 1;
      uVar7 = length;
    } while (uVar8 != 0);
  }
  uVar7 = length;
  if (0x1f < length) {
    do {
      *dest = color;
      dest[1] = color;
      dest[2] = color;
      dest[3] = color;
      dest[4] = color;
      dest[5] = color;
      dest[6] = color;
      dest[7] = color;
      dest[8] = color;
      dest[9] = color;
      dest[10] = color;
      dest[0xb] = color;
      dest[0xc] = color;
      dest[0xd] = color;
      dest[0xe] = color;
      dest[0xf] = color;
      dest[0x10] = color;
      dest[0x11] = color;
      dest[0x12] = color;
      dest[0x13] = color;
      dest[0x14] = color;
      dest[0x15] = color;
      dest[0x16] = color;
      dest[0x17] = color;
      dest[0x18] = color;
      dest[0x19] = color;
      dest[0x1a] = color;
      dest[0x1b] = color;
      dest[0x1c] = color;
      dest[0x1d] = color;
      dest[0x1e] = color;
      dest[0x1f] = color;
      dest = dest + 0x20;
      length = uVar7 - 0x20;
      bVar1 = 0x3f < uVar7;
      uVar7 = length;
    } while (bVar1);
  }
  if (0xf < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest[4] = color;
    dest[5] = color;
    dest[6] = color;
    dest[7] = color;
    dest[8] = color;
    dest[9] = color;
    dest[10] = color;
    dest[0xb] = color;
    dest[0xc] = color;
    dest[0xd] = color;
    dest[0xe] = color;
    dest[0xf] = color;
    dest = dest + 0x10;
    length = length - 0x10;
  }
  if (7 < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest[4] = color;
    dest[5] = color;
    dest[6] = color;
    dest[7] = color;
    dest = dest + 8;
    length = length - 8;
  }
  if (3 < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest = dest + 4;
    length = length - 4;
  }
  auVar4 = _DAT_00123060;
  auVar3 = _DAT_00123050;
  auVar2 = _DAT_00122280;
  if (length != 0) {
    lVar6 = (ulong)(uint)length - 1;
    auVar12._8_4_ = (int)lVar6;
    auVar12._0_8_ = lVar6;
    auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_00122280;
    do {
      auVar14._8_4_ = (int)uVar8;
      auVar14._0_8_ = uVar8;
      auVar14._12_4_ = (int)(uVar8 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar2;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        dest[uVar8] = color;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        dest[uVar8 + 1] = color;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar2;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        dest[uVar8 + 2] = color;
        dest[uVar8 + 3] = color;
      }
      uVar8 = uVar8 + 4;
    } while (((ulong)(uint)length + 3 & 0xfffffffffffffffc) != uVar8);
  }
  return;
}

Assistant:

static void composition_solid_source(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, color);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        color = BYTE_MUL(color, const_alpha);
        for(int i = 0; i < length; i++) {
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
        }
    }
}